

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDerv.h
# Opt level: O0

void __thiscall NaPNDerivative::~NaPNDerivative(NaPNDerivative *this)

{
  NaPetriNode *in_RDI;
  
  *(code **)in_RDI = NaPrintLog;
  NaVector::~NaVector((NaVector *)(in_RDI + 0x110));
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)(in_RDI + 0x90));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(in_RDI + 0x48));
  NaPetriNode::~NaPetriNode(in_RDI);
  return;
}

Assistant:

class PNNA_API NaPNDerivative : public NaPetriNode
{
public:

  // Create node for Petri network
  NaPNDerivative (const char* szNodeName = "derivative");


  ////////////////
  // Connectors //
  ////////////////

  // Input (mainstream)
  NaPetriCnInput	x;

  // Output (mainstream)
  NaPetriCnOutput	dx;


  ///////////////////////
  // Phases of network //
  ///////////////////////

  // 2. Link connectors inside the node
  virtual void		relate_connectors ();

  // 4. Allocate resources for internal usage
  virtual void		allocate_resources ();

  // 5. Verification to be sure all is OK (true)
  virtual bool		verify ();

  // 8. True action of the node (if activate returned true)
  virtual void		action ();

protected:/* data */

  // Vector of previous input
  NaVector		vPrev;
    
}